

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

void opengv::absolute_pose::fill3x10(Vector3d *x,Matrix<double,_3,_10,_0,_3,_10> *Phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  auVar7._0_8_ = -dVar1;
  auVar7._8_8_ = -dVar1;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0] =
       dVar1;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[3] =
       dVar1;
  dVar4 = dVar1 + dVar1;
  dVar3 = (double)vmovlpd_avx(auVar7);
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[6] =
       dVar3;
  dVar3 = (double)vmovlpd_avx(auVar7);
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[9] =
       dVar3;
  dVar2 = dVar2 + dVar2;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0xc]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0xf]
       = dVar2;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x12]
       = dVar5 * -2.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x18]
       = dVar2;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x1b]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[7] =
       dVar5;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[8] =
       -dVar6;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[10] =
       -dVar5;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0xb]
       = dVar6;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x10]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x13]
       = dVar4;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x16]
       = dVar4;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x19]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x1c]
       = dVar2;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[1] =
       dVar5;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[2] =
       dVar6;
  auVar8._0_8_ = dVar5 * 2.0;
  auVar8._8_8_ = dVar6 * -2.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[4] =
       -dVar5;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[5] =
       -dVar6;
  auVar7 = vshufpd_avx(auVar8,auVar8,1);
  dVar2 = (double)vmovlpd_avx(auVar8);
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x15]
       = dVar2;
  *(undefined1 (*) [16])
   ((Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array +
   0xd) = auVar7;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x11]
       = dVar1 * -2.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x14]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x17]
       = 0.0;
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x1a]
       = dVar4;
  dVar1 = (double)vmovlpd_avx(auVar8);
  (Phi->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array[0x1d]
       = dVar1;
  return;
}

Assistant:

void fill3x10( const Eigen::Vector3d & x, Eigen::Matrix<double,3,10> & Phi )
{
  double x1 = x[0];
  double x2 = x[1];
  double x3 = x[2];
  
  Phi << x1,  x1, -x1, -x1,     0.0,  2.0*x3, -2.0*x2, 2.0*x2, 2.0*x3,    0.0,
         x2, -x2,  x2, -x2, -2.0*x3,     0.0,  2.0*x1, 2.0*x1,    0.0, 2.0*x3,
         x3, -x3, -x3,  x3,  2.0*x2, -2.0*x1,     0.0,    0.0, 2.0*x1, 2.0*x2;
}